

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::RemoveContextHook(ImGuiContext *ctx,ImGuiID hook_id)

{
  ImGuiContextHook *pIVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = (long)(ctx->Hooks).Size;
  if (0 < lVar2) {
    pIVar1 = (ctx->Hooks).Data;
    lVar3 = 0;
    do {
      if (*(ImGuiID *)(pIVar1 + lVar3) == hook_id) {
        *(undefined4 *)(pIVar1 + lVar3 + 4) = 7;
      }
      lVar3 = lVar3 + 0x20;
    } while (lVar2 * 0x20 != lVar3);
  }
  return;
}

Assistant:

void ImGui::RemoveContextHook(ImGuiContext* ctx, ImGuiID hook_id)
{
    ImGuiContext& g = *ctx;
    IM_ASSERT(hook_id != 0);
    for (int n = 0; n < g.Hooks.Size; n++)
        if (g.Hooks[n].HookId == hook_id)
            g.Hooks[n].Type = ImGuiContextHookType_PendingRemoval_;
}